

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O2

bool __thiscall QSharedMemorySystemV::detach(QSharedMemorySystemV *this,QSharedMemoryPrivate *self)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QArrayDataPointer<char16_t> QStack_58;
  QArrayDataPointer<char16_t> local_40;
  QLatin1String local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = shmdt(self->memory);
  if (iVar2 < 0) {
    local_28.m_size = 0x15;
    local_28.m_data = "QSharedMemory::detach";
    piVar3 = __errno_location();
    if (*piVar3 == 0x16) {
      QSharedMemory::tr((QString *)&QStack_58,"%1: not attached",(char *)0x0,-1);
      QString::arg<QLatin1String,_true>
                ((QString *)&local_40,(QString *)&QStack_58,&local_28,0,(QChar)0x20);
      self->error = NotFound;
      QString::operator=(&self->errorString,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_58);
    }
    else {
      function.m_data = "QSharedMemory::detach";
      function.m_size = 0x15;
      QSharedMemoryPrivate::setUnixErrorString(self,function);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return false;
    }
  }
  else {
    self->memory = (void *)0x0;
    self->size = 0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      bVar1 = cleanHandle(this,self);
      return bVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QSharedMemorySystemV::detach(QSharedMemoryPrivate *self)
{
    // detach from the memory segment
    if (shmdt(self->memory) < 0) {
        const auto function = "QSharedMemory::detach"_L1;
        switch (errno) {
        case EINVAL:
            self->setError(QSharedMemory::NotFound,
                           QSharedMemory::tr("%1: not attached").arg(function));
            break;
        default:
            self->setUnixErrorString(function);
        }
        return false;
    }
    self->memory = nullptr;
    self->size = 0;

    return cleanHandle(self);
}